

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O3

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>,_std::tuple<>,_std::tuple<>_>
* __thiscall
nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
flag<(char)98,void>(basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *__return_storage_ptr__,void *this,initializer_list<char> short_names,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   long_names,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help,
                   flag_type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar3;
  pointer pcVar4;
  allocator_type local_191;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>,_std::tuple<>,_std::tuple<>_>
  *local_190;
  vector<char,_std::allocator<char>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  code *local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8;
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  local_d8;
  
  local_190 = __return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_188,short_names,(allocator_type *)&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170,long_names,&local_191);
  pcVar4 = (placeholder->_M_dataplus)._M_p;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar4,pcVar4 + placeholder->_M_string_length);
  pcVar4 = (help->_M_dataplus)._M_p;
  local_138 = &local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar4,pcVar4 + help->_M_string_length);
  local_108 = 0;
  uStack_100 = 0;
  local_e8 = type == exclusive;
  paVar1 = &local_d8.
            super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
            .
            super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
            ._M_head_impl.placeholder.field_2;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_170.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_170.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_170.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_158 == &local_148) {
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.placeholder.field_2._8_8_ = local_148._8_8_;
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.placeholder._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.placeholder._M_dataplus._M_p = (pointer)local_158;
  }
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.placeholder.field_2._M_allocated_capacity._1_7_ =
       local_148._M_allocated_capacity._1_7_;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.placeholder.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  paVar2 = &local_d8.
            super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
            .
            super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
            ._M_head_impl.help.field_2;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.placeholder._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  if (local_138 == &local_128) {
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.help.field_2._8_8_ = local_128._8_8_;
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.help._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.
    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
    .
    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
    ._M_head_impl.help._M_dataplus._M_p = (pointer)local_138;
  }
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.help.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.help.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.help._M_string_length = local_130;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.default_value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.default_value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118 = 0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.read._M_invoker =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_invoke;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.read.super__Function_base._M_functor._8_8_ = 0;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.read.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_manager;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_158 = &local_148;
  local_138 = &local_128;
  local_d8.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
  ._M_head_impl.exclusive = (bool)local_e8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'b',_void>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(local_190,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)this + 0x20),&local_d8,(tuple<> *)((long)this + 0x41),
                  (tuple<> *)((long)this + 0x42));
  if (local_d8.
      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
      .
      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
      ._M_head_impl.read.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar3 = &local_d8.
              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
              .
              super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
              ._M_head_impl.read;
    (*local_d8.
      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
      .
      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
      ._M_head_impl.read.super__Function_base._M_manager)
              ((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
  }
  if (local_d8.
      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
      .
      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
      ._M_head_impl.default_value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.
               super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
               .
               super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
               ._M_head_impl.default_value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.
         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
         .
         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
         ._M_head_impl.help._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                    ._M_head_impl.help._M_dataplus._M_p,
                    local_d8.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                    ._M_head_impl.help.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.
         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
         .
         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
         ._M_head_impl.placeholder._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                    ._M_head_impl.placeholder._M_dataplus._M_p,
                    local_d8.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                    ._M_head_impl.placeholder.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.
             super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
             .
             super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
             ._M_head_impl.long_names);
  if (local_d8.
      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
      .
      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
      ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                    ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                          .
                          super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                          ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>
                          .
                          super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_false>
                          ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,
                    CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  if (local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_190;
}

Assistant:

auto flag(
        std::initializer_list<char_type> short_names, std::initializer_list<String> long_names,
        String const &placeholder, String const &help, flag_type type = flag_type::normal) const
    {
        detail::flag<String, OptionType, Option, Value> f {
            short_names, long_names, placeholder, help, {},
            value_read<String, typename detail::value_of<String, Value>::type>(),
            type == flag_type::exclusive };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, detail::tuple_append(m_flags, std::move(f)), m_subcommands,
            m_arguments);
    }